

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O3

ssize_t xread(file_stream *strm,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  size_t __nbytes;
  ulong uVar3;
  
  uVar3 = count;
  if (count != 0) {
    do {
      __nbytes = 0x7fffffff;
      if (uVar3 < 0x7fffffff) {
        __nbytes = uVar3;
      }
      sVar1 = read(strm->fd,buf,__nbytes);
      if (sVar1 == 0) goto LAB_001065a3;
      if (sVar1 < 0) {
        piVar2 = __errno_location();
        if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
          msg_errno("Error reading from %s",strm->name);
          return -1;
        }
      }
      else {
        buf = (void *)((long)buf + sVar1);
        uVar3 = uVar3 - sVar1;
      }
    } while (uVar3 != 0);
  }
  uVar3 = 0;
LAB_001065a3:
  return count - uVar3;
}

Assistant:

ssize_t
xread(struct file_stream *strm, void *buf, size_t count)
{
	char *p = buf;
	size_t orig_count = count;

	while (count != 0) {
		ssize_t res = read(strm->fd, p, MIN(count, INT_MAX));
		if (res == 0)
			break;
		if (res < 0) {
			if (errno == EAGAIN || errno == EINTR)
				continue;
			msg_errno("Error reading from %"TS, strm->name);
			return -1;
		}
		p += res;
		count -= res;
	}
	return orig_count - count;
}